

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void trigger_nrx4_envelope(Emulator *e,Envelope *envelope,Address addr)

{
  char *pcVar1;
  uint local_20;
  Address addr_local;
  Envelope *envelope_local;
  Emulator *e_local;
  
  envelope->volume = envelope->initial_volume;
  if (envelope->period == '\0') {
    local_20 = 8;
  }
  else {
    local_20 = (uint)envelope->period;
  }
  envelope->timer = local_20;
  envelope->automatic = TRUE;
  if ((e->state).apu.frame == '\x06') {
    envelope->timer = envelope->timer + 1;
  }
  pcVar1 = get_apu_reg_string((uint)addr);
  HOOK_trigger_nrx4_info_asii
            (e,"trigger_nrx4_envelope",(ulong)addr,pcVar1,(ulong)envelope->volume,
             (ulong)envelope->timer);
  return;
}

Assistant:

static void trigger_nrx4_envelope(Emulator* e, Envelope* envelope,
                                  Address addr) {
  envelope->volume = envelope->initial_volume;
  envelope->timer = envelope->period ? envelope->period : ENVELOPE_MAX_PERIOD;
  envelope->automatic = TRUE;
  /* If the next APU frame will update the envelope, increment the timer. */
  if (UNLIKELY(APU.frame + 1 == FRAME_SEQUENCER_UPDATE_ENVELOPE_FRAME)) {
    envelope->timer++;
  }
  HOOK(trigger_nrx4_info_asii, addr, get_apu_reg_string(addr), envelope->volume,
       envelope->timer);
}